

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
          (ConstraintExprVisitor *this,SimpleAssignmentPatternExpression *expr)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  pointer ppEVar4;
  Expression *pEVar5;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  RandMode RVar10;
  ExpressionKind EVar11;
  SubroutineKind SVar12;
  Symbol *symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar13;
  byte bVar14;
  SourceLocation SVar15;
  DiagCode code;
  ASTContext *this_00;
  BinaryExpression *binExpr;
  long lVar17;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  SourceLocation SVar16;
  
  if ((this->failed != false) || (bVar8 = Expression::bad((Expression *)expr), bVar8))
  goto LAB_003ffd82;
  symbol = Expression::getSymbolReference((Expression *)expr,true);
  if ((symbol != (Symbol *)0x0) &&
     (((RVar10 = ASTContext::getRandMode(this->context,symbol), RVar10 != None &&
       (this->sawRandVars = true, RVar10 == RandC)) && (this->isSoft != false)))) {
    ASTContext::addDiag(this->context,(DiagCode)0x390008,
                        (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange);
  }
  EVar11 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if ((EVar11 < Conversion) && ((0x340000U >> (EVar11 & ValueRange) & 1) != 0)) {
    bVar14 = 0;
  }
  else {
    bVar8 = this->isTop;
    bVar9 = this->sawRandVars;
    this->isTop = false;
    this->sawRandVars = false;
    sVar3 = (expr->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value;
    if (sVar3 == 0) {
      bVar14 = 0;
    }
    else {
      ppEVar4 = (expr->super_AssignmentPatternExpressionBase).elements_._M_ptr;
      lVar17 = 0;
      do {
        pEVar5 = *(Expression **)((long)ppEVar4 + lVar17);
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
                  (pEVar5,pEVar5,this);
        lVar17 = lVar17 + 8;
      } while (sVar3 << 3 != lVar17);
      bVar14 = this->sawRandVars;
      EVar11 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
    }
    this->isTop = bVar8;
    this->sawRandVars = bVar9;
  }
  bVar8 = true;
  switch(EVar11) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_40,
                 (SVIntStorage *)&(expr->super_AssignmentPatternExpressionBase).elements_._M_extent)
    ;
    goto LAB_003ffc75;
  case RealLiteral:
  case TimeLiteral:
    this_00 = this->context;
    if (0 < (int)(((this_00->scope).ptr)->compilation->options).languageVersion) break;
    SVar16 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2f;
    goto LAB_003ffbad;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_40);
LAB_003ffc75:
    if ((0x40 < local_38 || (local_33 & 1) != 0) && ((void *)local_40.val != (void *)0x0)) {
      operator_delete__(local_40.pVal);
    }
    if ((local_33 & 1) == 0) {
      return true;
    }
    this_00 = this->context;
    SVar16 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x50;
    goto LAB_003ffbad;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case UnaryOp:
  case ConditionalOp:
  case Inside:
  case Assignment:
  case Concatenation:
  case Replication:
  case ElementSelect:
  case RangeSelect:
  case MemberAccess:
    break;
  case NamedValue:
  case HierarchicalValue:
    if (this->isTop == false) {
      return true;
    }
    break;
  case BinaryOp:
    uVar1 = *(uint *)&expr->isLValue;
    if (uVar1 < 0x17) {
      if ((0x79e600U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0x61800U >> (uVar1 & 0x1f) & 1) != 0) goto switchD_003ffb5d_caseD_11;
      }
      else if (((bVar14 & 1) != 0) &&
              (((pEVar5 = (Expression *)
                          (expr->super_AssignmentPatternExpressionBase).elements_._M_ptr,
                (pEVar5->kind & ~IntegerLiteral) == NamedValue &&
                (bVar9 = checkType(this,pEVar5), !bVar9)) ||
               ((pEVar5 = (Expression *)
                          (expr->super_AssignmentPatternExpressionBase).elements_._M_extent.
                          _M_extent_value, (pEVar5->kind & ~IntegerLiteral) == NamedValue &&
                (bVar9 = checkType(this,pEVar5), !bVar9)))))) goto LAB_003ffd82;
    }
    break;
  case Streaming:
switchD_003ffb5d_caseD_11:
    this_00 = this->context;
    SVar16 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x18;
LAB_003ffbad:
    sourceRange.endLoc = SVar15;
    sourceRange.startLoc = SVar16;
    ASTContext::addDiag(this_00,code,sourceRange);
    goto LAB_003ffd82;
  case Call:
    SVar12 = CallExpression::getSubroutineKind((CallExpression *)expr);
    if (SVar12 == Task) {
      this_00 = this->context;
      SVar16 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
      SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
      code.subsystem = Statements;
      code.code = 0x4b;
      goto LAB_003ffbad;
    }
    if (*(char *)&expr[1].super_AssignmentPatternExpressionBase.super_Expression.syntax != '\x01') {
      ppSVar13 = std::
                 get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)&(expr->super_AssignmentPatternExpressionBase).elements_);
      pSVar6 = *ppSVar13;
      if ((pSVar6->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pSVar6->super_Scope);
      }
      sVar3 = (pSVar6->arguments)._M_extent._M_extent_value;
      if (sVar3 != 0) {
        lVar17 = 0;
        do {
          lVar7 = *(long *)((long)(pSVar6->arguments)._M_ptr + lVar17);
          iVar2 = *(int *)(lVar7 + 0x158);
          if (iVar2 == 3) {
            if ((*(byte *)(lVar7 + 0x154) & 1) == 0) goto LAB_003ffd99;
          }
          else if (iVar2 - 1U < 2) {
LAB_003ffd99:
            this_00 = this->context;
            SVar16 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.
                     startLoc;
            SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.
                     endLoc;
            code.subsystem = Statements;
            code.code = 0x32;
            goto LAB_003ffbad;
          }
          lVar17 = lVar17 + 8;
        } while (sVar3 << 3 != lVar17);
      }
    }
    break;
  default:
    switch(EVar11) {
    case ValueRange:
      return true;
    case Dist:
      local_40 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_38 = local_38 & 0xffffff00;
      pEVar5 = (Expression *)(expr->super_AssignmentPatternExpressionBase).elements_._M_ptr;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                (pEVar5,pEVar5,(DistVarVisitor *)&local_40);
      if ((char)local_38 != '\0') {
        return true;
      }
      ASTContext::addDiag(this->context,(DiagCode)0x3c0008,pEVar5->sourceRange);
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_003ffb5d_caseD_11;
    }
  }
  bVar9 = checkType(this,(Expression *)expr);
  if (!bVar9) {
LAB_003ffd82:
    this->failed = true;
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool visit(const T& expr) {
        if (failed || expr.bad())
            return fail();

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (auto sym = expr.getSymbolReference()) {
                RandMode mode = context.getRandMode(*sym);
                if (mode != RandMode::None)
                    sawRandVars = true;

                if (isSoft && mode == RandMode::RandC)
                    context.addDiag(diag::RandCInSoft, expr.sourceRange);
            }

            bool childrenHaveRand = false;

            if constexpr (HasVisitExprs<T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {

                    const bool oldTop = std::exchange(isTop, false);
                    const bool oldSawRand = std::exchange(sawRandVars, false);
                    expr.visitExprs(*this);
                    isTop = oldTop;
                    childrenHaveRand = sawRandVars;
                    sawRandVars = oldSawRand;
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return fail();
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    if (context.getCompilation().languageVersion() < LanguageVersion::v1800_2023) {
                        context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    auto& binExpr = expr.template as<BinaryExpression>();
                    switch (binExpr.op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return fail();
                        case BinaryOperator::Equality:
                        case BinaryOperator::Inequality:
                        case BinaryOperator::GreaterThanEqual:
                        case BinaryOperator::GreaterThan:
                        case BinaryOperator::LessThanEqual:
                        case BinaryOperator::LessThan:
                        case BinaryOperator::LogicalAnd:
                        case BinaryOperator::LogicalOr:
                        case BinaryOperator::LogicalImplication:
                        case BinaryOperator::LogicalEquivalence:
                            // We previously ignored invalid types of NamedValues when
                            // we visited subexpressions. If there were any rand vars
                            // used in our subexpressions we should re-check named values
                            // for the stricter integral / numeric type requirements.
                            if (childrenHaveRand) {
                                if (ValueExpressionBase::isKind(binExpr.left().kind) &&
                                    !checkType(binExpr.left())) {
                                    return fail();
                                }

                                if (ValueExpressionBase::isKind(binExpr.right().kind) &&
                                    !checkType(binExpr.right())) {
                                    return fail();
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                    if (!isTop)
                        return true;
                    break;
                case ExpressionKind::ValueRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return fail();
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                arg->direction == ArgumentDirection::InOut ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return fail();
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!checkType(expr))
                return fail();
        }

        return true;
    }